

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text-buffer.cc
# Opt level: O1

void __thiscall TextBuffer::TextBuffer(TextBuffer *this,u16string *text)

{
  pointer pcVar1;
  u16string local_38;
  
  pcVar1 = (text->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::u16string::
  _M_construct<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>>
            ((u16string *)&local_38,pcVar1,pcVar1 + text->_M_string_length);
  TextBuffer(this,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity * 2 + 2);
  }
  return;
}

Assistant:

TextBuffer::TextBuffer(const std::u16string &text) :
  TextBuffer{u16string{text.begin(), text.end()}} {}